

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O2

int main(void)

{
  ostringstream *poVar1;
  bool bVar2;
  OutputWorker *pOVar3;
  char *pcVar4;
  LogStringBuffer local_1a0;
  
  if ((int)Logger.ChannelMinLevel < 3) {
    poVar1 = &local_1a0.LogStream;
    local_1a0.ChannelName = Logger.ChannelName;
    local_1a0.LogLevel = Info;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
    std::operator<<((ostream *)poVar1,"Basic API test running for 2 seconds");
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,&local_1a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  bVar2 = TestAPI();
  if ((int)Logger.ChannelMinLevel < 3) {
    poVar1 = &local_1a0.LogStream;
    local_1a0.ChannelName = Logger.ChannelName;
    local_1a0.LogLevel = Info;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
    std::operator<<((ostream *)poVar1,"Test returned result = ");
    pcVar4 = "false";
    if (bVar2) {
      pcVar4 = "true";
    }
    std::operator<<((ostream *)poVar1,pcVar4);
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,&local_1a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  return bVar2 - 1;
}

Assistant:

int main()
{
    Logger.Info("Basic API test running for 2 seconds");

    const bool result = TestAPI();

    Logger.Info("Test returned result = ", result);

    return result ? 0 : -1;
}